

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR mergebackward(LispPTR base)

{
  uint uVar1;
  LispPTR base_00;
  
  if (base == 0) {
    base = 0;
  }
  else {
    uVar1 = base - 2;
    if ((base & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
    }
    if ((((*ArrayMerging_word != 0) && (*ArraySpace_word != base)) && (*ArraySpace2_word != base))
       && ((Lisp_world[(ulong)uVar1 + 1] & 1) == 0)) {
      base_00 = base + (uint)Lisp_world[uVar1] * -2;
      checkarrayblock(base_00,1,0);
      deleteblock(base_00);
      arrayblockmerger(base_00,base);
      return base_00;
    }
    linkblock(base);
  }
  return base;
}

Assistant:

LispPTR mergebackward(LispPTR base) {
  LispPTR pbase;
  struct arrayblock *ptrailer;

  if (base == NIL)
    return (NIL);
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);
  if ((*ArrayMerging_word == NIL) ||
           ((base == *ArraySpace_word) || ((base == *ArraySpace2_word) || (ptrailer->inuse == T))))
    return (linkblock(base));
  pbase = base - 2 * ptrailer->arlen;
  checkarrayblock(pbase, T, NIL);
  deleteblock(pbase);
  return (arrayblockmerger(pbase, base));
}